

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_warm_start(OSQPWorkspace *work,c_float *x,c_float *y)

{
  c_float *in_RDX;
  c_float *in_RSI;
  long *in_RDI;
  char *in_stack_ffffffffffffffd8;
  c_int local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = _osqp_error((osqp_error_type)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffd8);
  }
  else {
    if (*(long *)(in_RDI[0x17] + 0xa0) == 0) {
      *(undefined8 *)(in_RDI[0x17] + 0xa0) = 1;
    }
    prea_vec_copy(in_RSI,(c_float *)in_RDI[6],*(c_int *)*in_RDI);
    prea_vec_copy(in_RDX,(c_float *)in_RDI[7],*(c_int *)(*in_RDI + 8));
    if (*(long *)(in_RDI[0x17] + 0x10) != 0) {
      vec_ew_prod(*(c_float **)(in_RDI[0x18] + 0x20),(c_float *)in_RDI[6],(c_float *)in_RDI[6],
                  *(c_int *)*in_RDI);
      vec_ew_prod(*(c_float **)(in_RDI[0x18] + 0x28),(c_float *)in_RDI[7],(c_float *)in_RDI[7],
                  *(c_int *)(*in_RDI + 8));
      vec_mult_scalar((c_float *)in_RDI[7],*(c_float *)in_RDI[0x18],*(c_int *)(*in_RDI + 8));
    }
    mat_vec(*(csc **)(*in_RDI + 0x18),(c_float *)in_RDI[6],(c_float *)in_RDI[8],0);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

c_int osqp_warm_start(OSQPWorkspace *work, const c_float *x, const c_float *y) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Update warm_start setting to true
  if (!work->settings->warm_start) work->settings->warm_start = 1;

  // Copy primal and dual variables into the iterates
  prea_vec_copy(x, work->x, work->data->n);
  prea_vec_copy(y, work->y, work->data->m);

  // Scale iterates
  if (work->settings->scaling) {
    vec_ew_prod(work->scaling->Dinv, work->x, work->x, work->data->n);
    vec_ew_prod(work->scaling->Einv, work->y, work->y, work->data->m);
    vec_mult_scalar(work->y, work->scaling->c, work->data->m);
  }

  // Compute Ax = z and store it in z
  mat_vec(work->data->A, work->x, work->z, 0);

  return 0;
}